

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_xor.cpp
# Opt level: O0

void example::learning_xor(void)

{
  longdouble lVar1;
  longdouble lVar2;
  undefined1 acceptableError [16];
  undefined1 learningRate [16];
  undefined1 acceptableError_00 [16];
  undefined1 learningRate_00 [16];
  undefined1 adaptiveLearningRate [16];
  undefined1 adaptiveLearningRate_00 [16];
  tensor ppplVar3;
  tensor ppplVar4;
  tensor ppplVar5;
  FullyConnected *pFVar6;
  Loss *pLVar7;
  ostream *poVar8;
  Layer *pLVar9;
  char *__to;
  char *__to_00;
  undefined6 in_stack_fffffffffffffd82;
  undefined6 in_stack_fffffffffffffd92;
  Layer *local_180;
  Layer *local_168;
  int local_140;
  int local_13c;
  int i_1;
  int i;
  SequentialModule moduleB;
  undefined1 local_b8 [8];
  SequentialModule moduleA;
  tensor out [4];
  tensor in [4];
  
  out[3] = type::createTensor(2,1,1);
  ppplVar3 = type::createTensor(2,1,1);
  ppplVar4 = type::createTensor(2,1,1);
  ppplVar5 = type::createTensor(2,1,1);
  moduleA._adaptiveLearningRate._8_8_ = type::createTensor(1,1,1);
  out[0] = type::createTensor(1,1,1);
  out[1] = type::createTensor(1,1,1);
  out[2] = type::createTensor(1,1,1);
  lVar2 = (longdouble)0;
  ***out[3] = lVar2;
  (**out[3])[1] = lVar2;
  ***moduleA._adaptiveLearningRate._8_8_ = lVar2;
  ***ppplVar3 = lVar2;
  lVar1 = (longdouble)1;
  (**ppplVar3)[1] = lVar1;
  ***out[0] = lVar1;
  ***ppplVar4 = lVar1;
  (**ppplVar4)[1] = lVar2;
  ***out[1] = lVar1;
  ***ppplVar5 = lVar1;
  (**ppplVar5)[1] = lVar1;
  ***out[2] = lVar2;
  function::tool::initParamRandTool(-0.1,0.1);
  function::tool::initRandTool(0x76c2e);
  module::SequentialModule::SequentialModule((SequentialModule *)local_b8);
  acceptableError._10_6_ = in_stack_fffffffffffffd82;
  acceptableError._0_10_ = (longdouble)0.001;
  module::SequentialModule::setStopParameter
            ((SequentialModule *)local_b8,100,(scalar)acceptableError);
  learningRate._10_6_ = in_stack_fffffffffffffd82;
  learningRate._0_10_ = (longdouble)0.2;
  adaptiveLearningRate._10_6_ = in_stack_fffffffffffffd92;
  adaptiveLearningRate._0_10_ = (longdouble)1e-10;
  module::SequentialModule::setTrainingParameter
            ((SequentialModule *)local_b8,(scalar)learningRate,(scalar)adaptiveLearningRate);
  module::SequentialModule::setInput((SequentialModule *)local_b8,2,1,1);
  pFVar6 = (FullyConnected *)operator_new(0x78);
  layer::FullyConnected::FullyConnected(pFVar6,1,5,false);
  module::SequentialModule::add((SequentialModule *)local_b8,(Layer *)pFVar6);
  pLVar7 = (Loss *)operator_new(0x88);
  layer::Loss::Loss(pLVar7,1,5,2,false);
  local_168 = (Layer *)0x0;
  if (pLVar7 != (Loss *)0x0) {
    local_168 = (Layer *)((long)&pLVar7->_vptr_Loss + (long)pLVar7->_vptr_Loss[-3]);
  }
  module::SequentialModule::add((SequentialModule *)local_b8,local_168);
  module::SequentialModule::link((SequentialModule *)local_b8,(char *)local_168,__to);
  module::SequentialModule::training
            ((SequentialModule *)local_b8,out + 3,
             (tensor *)((long)&moduleA._adaptiveLearningRate + 8),4,1.0);
  function::tool::initRandTool(0x76c2e);
  module::SequentialModule::SequentialModule((SequentialModule *)&i_1);
  acceptableError_00._10_6_ = in_stack_fffffffffffffd82;
  acceptableError_00._0_10_ = (longdouble)0.001;
  module::SequentialModule::setStopParameter
            ((SequentialModule *)&i_1,1000,(scalar)acceptableError_00);
  learningRate_00._10_6_ = in_stack_fffffffffffffd82;
  learningRate_00._0_10_ = (longdouble)0.2;
  adaptiveLearningRate_00._10_6_ = in_stack_fffffffffffffd92;
  adaptiveLearningRate_00._0_10_ = (longdouble)1e-10;
  module::SequentialModule::setTrainingParameter
            ((SequentialModule *)&i_1,(scalar)learningRate_00,(scalar)adaptiveLearningRate_00);
  module::SequentialModule::setInput((SequentialModule *)&i_1,2,1,1);
  pFVar6 = (FullyConnected *)operator_new(0x78);
  layer::FullyConnected::FullyConnected(pFVar6,2,2,true);
  module::SequentialModule::add((SequentialModule *)&i_1,(Layer *)pFVar6);
  pLVar7 = (Loss *)operator_new(0x88);
  layer::Loss::Loss(pLVar7,1,2,2,true);
  local_180 = (Layer *)0x0;
  if (pLVar7 != (Loss *)0x0) {
    local_180 = (Layer *)((long)&pLVar7->_vptr_Loss + (long)pLVar7->_vptr_Loss[-3]);
  }
  module::SequentialModule::add((SequentialModule *)&i_1,local_180);
  module::SequentialModule::link((SequentialModule *)&i_1,(char *)local_180,__to_00);
  module::SequentialModule::training
            ((SequentialModule *)&i_1,out + 3,(tensor *)((long)&moduleA._adaptiveLearningRate + 8),4
             ,1.0);
  poVar8 = std::operator<<((ostream *)&std::cout,"- Module A (ACTIVATION_GAUSSIAN): ");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  for (local_13c = 0; local_13c < 4; local_13c = local_13c + 1) {
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,***out[(long)local_13c + 3]);
    poVar8 = std::operator<<(poVar8," xor ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(**out[(long)local_13c + 3])[1]);
    poVar8 = std::operator<<(poVar8," => ");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<((ostream *)&std::cout,"   Out : ");
    ppplVar3 = module::SequentialModule::predict
                         ((SequentialModule *)local_b8,out[(long)local_13c + 3]);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,***ppplVar3);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<((ostream *)&std::cout,"   Layer  : ");
    pLVar9 = module::SequentialModule::getLayer((SequentialModule *)local_b8,0);
    ppplVar3 = layer::Layer::getPtrOut(pLVar9);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,***ppplVar3);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"\n\n- Module B (ACTIVATION_SIGMOIDE): ");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  for (local_140 = 0; local_140 < 4; local_140 = local_140 + 1) {
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,***out[(long)local_140 + 3]);
    poVar8 = std::operator<<(poVar8," xor ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(**out[(long)local_140 + 3])[1]);
    poVar8 = std::operator<<(poVar8," => ");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<((ostream *)&std::cout,"   Out : ");
    ppplVar3 = module::SequentialModule::predict((SequentialModule *)&i_1,out[(long)local_140 + 3]);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,***ppplVar3);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<((ostream *)&std::cout,"   Layer  : ");
    pLVar9 = module::SequentialModule::getLayer((SequentialModule *)&i_1,0);
    ppplVar3 = layer::Layer::getPtrOut(pLVar9);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,***ppplVar3);
    poVar8 = std::operator<<(poVar8,", ");
    pLVar9 = module::SequentialModule::getLayer((SequentialModule *)&i_1,0);
    ppplVar3 = layer::Layer::getPtrOut(pLVar9);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(**ppplVar3)[1]);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  module::SequentialModule::~SequentialModule((SequentialModule *)&i_1);
  module::SequentialModule::~SequentialModule((SequentialModule *)local_b8);
  return;
}

Assistant:

void learning_xor()
    {


        type::tensor in[4];
        in[0] = type::createTensor(2, 1, 1);
        in[1] = type::createTensor(2, 1, 1);
        in[2] = type::createTensor(2, 1, 1);
        in[3] = type::createTensor(2, 1, 1);

        type::tensor out[4];
        out[0] = type::createTensor(1, 1, 1);
        out[1] = type::createTensor(1, 1, 1);
        out[2] = type::createTensor(1, 1, 1);
        out[3] = type::createTensor(1, 1, 1);



        (**in[0])[0] = 0;
        (**in[0])[1] = 0;
        (***out[0]) = 0;

        (**in[1])[0] = 0;
        (**in[1])[1] = 1;
        (***out[1]) = 1;

        (**in[2])[0] = 1;
        (**in[2])[1] = 0;
        (***out[2]) = 1;

        (**in[3])[0] = 1;
        (**in[3])[1] = 1;
        (***out[3]) = 0;



        function::tool::initParamRandTool(-0.1, 0.1);
        function::tool::initRandTool(486446);
        module::SequentialModule moduleA;
        moduleA.setStopParameter(100, 0.001);
        moduleA.setTrainingParameter(0.2, 0.0000000001);
        moduleA.setInput(2);
        moduleA.add(new layer::FullyConnected(1, ACTIVATION_GAUSSIAN, false));
        moduleA.add(new layer::Loss(1, ACTIVATION_GAUSSIAN, LOSS_LOGLOSS, false));
        moduleA.link();
        moduleA.training(in, out, 4, 1);

        function::tool::initRandTool(486446);
        module::SequentialModule moduleB;
        moduleB.setStopParameter(1000, 0.001);
        moduleB.setTrainingParameter(0.2, 0.0000000001);
        moduleB.setInput(2);
        moduleB.add(new layer::FullyConnected(2, ACTIVATION_SIGMOIDE, true));
        moduleB.add(new layer::Loss(1, ACTIVATION_SIGMOIDE, LOSS_LOGLOSS, true));
        moduleB.link();
        moduleB.training(in, out, 4, 1);


        std::cout << "- Module A (ACTIVATION_GAUSSIAN): " << std::endl;
        for(int i(0); i < 4 ; i++)
        {
            std::cout << in[i][0][0][0] << " xor " << in[i][0][0][1] << " => " << std::endl;
            std::cout << "   Out : " << ***moduleA.predict(in[i]) << std::endl;
            std::cout << "   Layer  : " << (**moduleA.getLayer(0)->getPtrOut())[0] << std::endl;
        }


        std::cout << "\n\n- Module B (ACTIVATION_SIGMOIDE): " << std::endl;
        for(int i(0); i < 4 ; i++)
        {
            std::cout << in[i][0][0][0] << " xor " << in[i][0][0][1] << " => " << std::endl;
            std::cout << "   Out : " << ***moduleB.predict(in[i]) << std::endl;
            std::cout << "   Layer  : "
            << (**moduleB.getLayer(0)->getPtrOut())[0] << ", "
            << (**moduleB.getLayer(0)->getPtrOut())[1] << std::endl;
        }
    }